

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall
crnlib::dynamic_string::format_args(dynamic_string *this,char *p,__va_list_tag *args)

{
  uint uVar1;
  char buf [4096];
  char acStack_1018 [4096];
  
  uVar1 = vsnprintf(acStack_1018,0x1000,p,args);
  if ((int)uVar1 < 1) {
    clear(this);
  }
  else {
    if ((uVar1 < 0xffff) && (this->m_buf_size <= uVar1)) {
      expand_buf(this,uVar1 + 1,false);
    }
    if (uVar1 < this->m_buf_size) {
      memcpy(this->m_pStr,acStack_1018,(ulong)(uVar1 + 1));
      this->m_len = (uint16)uVar1;
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::format_args(const char* p, va_list args)
    {
        CRNLIB_ASSERT(p);

        const uint cBufSize = 4096;
        char buf[cBufSize];

#if defined(CRN_CC_MSVC)
        int l = vsnprintf_s(buf, cBufSize, _TRUNCATE, p, args);
#else
        int l = vsnprintf(buf, cBufSize, p, args);
#endif
        if (l <= 0)
        {
            clear();
        }
        else if (ensure_buf(l, false))
        {
            memcpy(m_pStr, buf, l + 1);

            m_len = static_cast<uint16>(l);

            check();
        }

        return *this;
    }